

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall CVmFormatter::buffer_string(CVmFormatter *this,char *txt)

{
  wchar_t wVar1;
  
  while( true ) {
    wVar1 = utf8_ptr::s_getch(txt);
    if (wVar1 == L'\0') break;
    wVar1 = utf8_ptr::s_getch(txt);
    buffer_char(this,wVar1);
    txt = (char *)((byte *)txt +
                  (ulong)((((byte)*txt >> 5 & 1) != 0) + 1 & (uint)((byte)*txt >> 7) * 3) + 1);
  }
  return;
}

Assistant:

void CVmFormatter::buffer_string(VMG_ const char *txt)
{
    /* write out each character in the string */
    for ( ; utf8_ptr::s_getch(txt) != 0 ; txt += utf8_ptr::s_charsize(*txt))
        buffer_char(vmg_ utf8_ptr::s_getch(txt));
}